

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Textures.cpp
# Opt level: O2

SP __thiscall pbrt::SemanticParser::findOrCreateTexture(SemanticParser *this,SP *in)

{
  map<std::shared_ptr<pbrt::syntactic::Texture>,_std::shared_ptr<pbrt::Texture>,_std::less<std::shared_ptr<pbrt::syntactic::Texture>_>,_std::allocator<std::pair<const_std::shared_ptr<pbrt::syntactic::Texture>,_std::shared_ptr<pbrt::Texture>_>_>_>
  *this_00;
  mapped_type *pmVar1;
  __shared_ptr<pbrt::Texture,_(__gnu_cxx::_Lock_policy)2> *p_Var2;
  __shared_ptr<pbrt::syntactic::Texture,_(__gnu_cxx::_Lock_policy)2> *in_RDX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  SP SVar3;
  
  this_00 = (map<std::shared_ptr<pbrt::syntactic::Texture>,_std::shared_ptr<pbrt::Texture>,_std::less<std::shared_ptr<pbrt::syntactic::Texture>_>,_std::allocator<std::pair<const_std::shared_ptr<pbrt::syntactic::Texture>,_std::shared_ptr<pbrt::Texture>_>_>_>
             *)(in + 2);
  pmVar1 = std::
           map<std::shared_ptr<pbrt::syntactic::Texture>,_std::shared_ptr<pbrt::Texture>,_std::less<std::shared_ptr<pbrt::syntactic::Texture>_>,_std::allocator<std::pair<const_std::shared_ptr<pbrt::syntactic::Texture>,_std::shared_ptr<pbrt::Texture>_>_>_>
           ::operator[](this_00,(key_type *)in_RDX);
  if ((pmVar1->super___shared_ptr<pbrt::Texture,_(__gnu_cxx::_Lock_policy)2>)._M_ptr ==
      (element_type *)0x0) {
    std::__shared_ptr<pbrt::syntactic::Texture,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              ((__shared_ptr<pbrt::syntactic::Texture,_(__gnu_cxx::_Lock_policy)2> *)
               &stack0xffffffffffffffc8,in_RDX);
    createTextureFrom((SemanticParser *)&stack0xffffffffffffffb8,in);
    p_Var2 = &std::
              map<std::shared_ptr<pbrt::syntactic::Texture>,_std::shared_ptr<pbrt::Texture>,_std::less<std::shared_ptr<pbrt::syntactic::Texture>_>,_std::allocator<std::pair<const_std::shared_ptr<pbrt::syntactic::Texture>,_std::shared_ptr<pbrt::Texture>_>_>_>
              ::operator[](this_00,(key_type *)in_RDX)->
              super___shared_ptr<pbrt::Texture,_(__gnu_cxx::_Lock_policy)2>;
    std::__shared_ptr<pbrt::Texture,_(__gnu_cxx::_Lock_policy)2>::operator=
              (p_Var2,(__shared_ptr<pbrt::Texture,_(__gnu_cxx::_Lock_policy)2> *)
                      &stack0xffffffffffffffb8);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&stack0xffffffffffffffc0);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&stack0xffffffffffffffd0);
  }
  p_Var2 = &std::
            map<std::shared_ptr<pbrt::syntactic::Texture>,_std::shared_ptr<pbrt::Texture>,_std::less<std::shared_ptr<pbrt::syntactic::Texture>_>,_std::allocator<std::pair<const_std::shared_ptr<pbrt::syntactic::Texture>,_std::shared_ptr<pbrt::Texture>_>_>_>
            ::operator[](this_00,(key_type *)in_RDX)->
            super___shared_ptr<pbrt::Texture,_(__gnu_cxx::_Lock_policy)2>;
  std::__shared_ptr<pbrt::Texture,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            ((__shared_ptr<pbrt::Texture,_(__gnu_cxx::_Lock_policy)2> *)this,p_Var2);
  SVar3.super___shared_ptr<pbrt::Texture,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  SVar3.super___shared_ptr<pbrt::Texture,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)this;
  return (SP)SVar3.super___shared_ptr<pbrt::Texture,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

Texture::SP SemanticParser::findOrCreateTexture(pbrt::syntactic::Texture::SP in)
  {
    if (!textureMapping[in]) {
      textureMapping[in] = createTextureFrom(in);
    }
    return textureMapping[in];
  }